

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationsTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VertexAttribLocationsTest *this,GLuint test_case_index)

{
  TestError *this_00;
  GLuint test_case_index_local;
  VertexAttribLocationsTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(test_case_index) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DrawArrays");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DrawArraysInstanced");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DrawElements");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DrawElementsBaseVertex");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DrawElementsInstanced");
    break;
  case 5:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"DrawElementsInstancedBaseInstance");
    break;
  case 6:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"DrawElementsInstancedBaseVertex");
    break;
  case 7:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"DrawElementsInstancedBaseVertexBaseInstance");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x30e5);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VertexAttribLocationsTest::getTestCaseName(glw::GLuint test_case_index)
{
	std::string result;

	switch (test_case_index)
	{
	case DRAWARRAYS:
		result = "DrawArrays";
		break;
	case DRAWARRAYSINSTANCED:
		result = "DrawArraysInstanced";
		break;
	case DRAWELEMENTS:
		result = "DrawElements";
		break;
	case DRAWELEMENTSBASEVERTEX:
		result = "DrawElementsBaseVertex";
		break;
	case DRAWELEMENTSINSTANCED:
		result = "DrawElementsInstanced";
		break;
	case DRAWELEMENTSINSTANCEDBASEINSTANCE:
		result = "DrawElementsInstancedBaseInstance";
		break;
	case DRAWELEMENTSINSTANCEDBASEVERTEX:
		result = "DrawElementsInstancedBaseVertex";
		break;
	case DRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE:
		result = "DrawElementsInstancedBaseVertexBaseInstance";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}